

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  char cVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  NodeRef *pNVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined4 uVar38;
  ulong unaff_R15;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar39 [16];
  undefined1 auVar42 [32];
  float fVar44;
  undefined1 auVar43 [32];
  float fVar45;
  float fVar51;
  float fVar52;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar53;
  undefined1 auVar48 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar65 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar79;
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [64];
  float fVar83;
  vfloat4 a0;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar103;
  float fVar104;
  undefined1 auVar102 [16];
  float fVar105;
  undefined1 auVar106 [32];
  float fVar107;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  NodeRef stack [564];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar70 = ray->tfar, 0.0 <= fVar70)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar39 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar57 = vrsqrtss_avx(auVar39,auVar39);
    fVar83 = auVar57._0_4_;
    pre.depth_scale = fVar83 * 1.5 - auVar39._0_4_ * 0.5 * fVar83 * fVar83 * fVar83;
    fVar83 = (ray->dir).field_0.m128[0];
    fVar3 = (ray->dir).field_0.m128[1];
    fVar4 = (ray->dir).field_0.m128[2];
    auVar46 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
    auVar84._0_4_ = aVar7.x * auVar46._0_4_;
    auVar84._4_4_ = aVar7.y * auVar46._4_4_;
    auVar84._8_4_ = aVar7.z * auVar46._8_4_;
    auVar84._12_4_ = aVar7.field_3.w * auVar46._12_4_;
    auVar57 = vshufpd_avx(auVar84,auVar84,1);
    auVar39 = vmovshdup_avx(auVar84);
    auVar99._8_4_ = 0x80000000;
    auVar99._0_8_ = 0x8000000080000000;
    auVar99._12_4_ = 0x80000000;
    auVar89._12_4_ = 0;
    auVar89._0_12_ = ZEXT812(0);
    auVar89 = auVar89 << 0x20;
    auVar64 = vunpckhps_avx(auVar84,auVar89);
    auVar71 = vshufps_avx(auVar64,ZEXT416(auVar39._0_4_ ^ 0x80000000),0x41);
    auVar95._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
    auVar95._8_8_ = auVar57._8_8_ ^ auVar99._8_8_;
    auVar64 = vinsertps_avx(auVar95,auVar84,0x2a);
    auVar39 = vdpps_avx(auVar71,auVar71,0x7f);
    auVar57 = vdpps_avx(auVar64,auVar64,0x7f);
    auVar39 = vcmpps_avx(auVar57,auVar39,1);
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar39 = vblendvps_avx(auVar64,auVar71,auVar39);
    auVar57 = vdpps_avx(auVar39,auVar39,0x7f);
    auVar64 = vrsqrtss_avx(auVar57,auVar57);
    fVar92 = auVar64._0_4_;
    auVar57 = ZEXT416((uint)(fVar92 * 1.5 - auVar57._0_4_ * 0.5 * fVar92 * fVar92 * fVar92));
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    auVar96._0_4_ = auVar39._0_4_ * auVar57._0_4_;
    auVar96._4_4_ = auVar39._4_4_ * auVar57._4_4_;
    auVar96._8_4_ = auVar39._8_4_ * auVar57._8_4_;
    auVar96._12_4_ = auVar39._12_4_ * auVar57._12_4_;
    auVar39 = vshufps_avx(auVar96,auVar96,0xc9);
    auVar57 = vshufps_avx(auVar84,auVar84,0xc9);
    auVar102._0_4_ = auVar57._0_4_ * auVar96._0_4_;
    auVar102._4_4_ = auVar57._4_4_ * auVar96._4_4_;
    auVar102._8_4_ = auVar57._8_4_ * auVar96._8_4_;
    auVar102._12_4_ = auVar57._12_4_ * auVar96._12_4_;
    auVar100._0_4_ = auVar39._0_4_ * auVar84._0_4_;
    auVar100._4_4_ = auVar39._4_4_ * auVar84._4_4_;
    auVar100._8_4_ = auVar39._8_4_ * auVar84._8_4_;
    auVar100._12_4_ = auVar39._12_4_ * auVar84._12_4_;
    auVar39 = vsubps_avx(auVar100,auVar102);
    auVar64 = vshufps_avx(auVar39,auVar39,0xc9);
    auVar39 = vdpps_avx(auVar64,auVar64,0x7f);
    auVar57 = vrsqrtss_avx(auVar39,auVar39);
    fVar92 = auVar57._0_4_;
    auVar39 = ZEXT416((uint)(fVar92 * 1.5 - auVar39._0_4_ * 0.5 * fVar92 * fVar92 * fVar92));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar57._0_4_ = auVar64._0_4_ * auVar39._0_4_;
    auVar57._4_4_ = auVar64._4_4_ * auVar39._4_4_;
    auVar57._8_4_ = auVar64._8_4_ * auVar39._8_4_;
    auVar57._12_4_ = auVar64._12_4_ * auVar39._12_4_;
    auVar39._0_4_ = auVar46._0_4_ * auVar84._0_4_;
    auVar39._4_4_ = auVar46._4_4_ * auVar84._4_4_;
    auVar39._8_4_ = auVar46._8_4_ * auVar84._8_4_;
    auVar39._12_4_ = auVar46._12_4_ * auVar84._12_4_;
    auVar64 = vunpcklps_avx(auVar96,auVar39);
    auVar39 = vunpckhps_avx(auVar96,auVar39);
    auVar46 = vunpcklps_avx(auVar57,auVar89);
    auVar88 = ZEXT1664(auVar46);
    auVar57 = vunpckhps_avx(auVar57,auVar89);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar39,auVar57)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar64,auVar46)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar64,auVar46)
    ;
    pNVar34 = stack + 1;
    auVar57 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar63 = ZEXT1664(auVar57);
    auVar64._8_4_ = 0x7fffffff;
    auVar64._0_8_ = 0x7fffffff7fffffff;
    auVar64._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx((undefined1  [16])aVar7,auVar64);
    auVar71._8_4_ = 0x219392ef;
    auVar71._0_8_ = 0x219392ef219392ef;
    auVar71._12_4_ = 0x219392ef;
    auVar39 = vcmpps_avx(auVar39,auVar71,1);
    auVar39 = vblendvps_avx((undefined1  [16])aVar7,auVar71,auVar39);
    auVar64 = vrcpps_avx(auVar39);
    fVar45 = auVar64._0_4_;
    auVar46._0_4_ = auVar39._0_4_ * fVar45;
    fVar77 = auVar64._4_4_;
    auVar46._4_4_ = auVar39._4_4_ * fVar77;
    fVar51 = auVar64._8_4_;
    auVar46._8_4_ = auVar39._8_4_ * fVar51;
    fVar78 = auVar64._12_4_;
    auVar46._12_4_ = auVar39._12_4_ * fVar78;
    auVar72._8_4_ = 0x3f800000;
    auVar72._0_8_ = &DAT_3f8000003f800000;
    auVar72._12_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar72,auVar46);
    fVar92 = (ray->org).field_0.m128[0];
    auVar90._4_4_ = fVar92;
    auVar90._0_4_ = fVar92;
    auVar90._8_4_ = fVar92;
    auVar90._12_4_ = fVar92;
    auVar90._16_4_ = fVar92;
    auVar90._20_4_ = fVar92;
    auVar90._24_4_ = fVar92;
    auVar90._28_4_ = fVar92;
    fVar5 = (ray->org).field_0.m128[1];
    auVar93._4_4_ = fVar5;
    auVar93._0_4_ = fVar5;
    auVar93._8_4_ = fVar5;
    auVar93._12_4_ = fVar5;
    auVar93._16_4_ = fVar5;
    auVar93._20_4_ = fVar5;
    auVar93._24_4_ = fVar5;
    auVar93._28_4_ = fVar5;
    fVar6 = (ray->org).field_0.m128[2];
    auVar97._4_4_ = fVar6;
    auVar97._0_4_ = fVar6;
    auVar97._8_4_ = fVar6;
    auVar97._12_4_ = fVar6;
    auVar97._16_4_ = fVar6;
    auVar97._20_4_ = fVar6;
    auVar97._24_4_ = fVar6;
    auVar97._28_4_ = fVar6;
    auVar47._0_4_ = fVar45 + fVar45 * auVar39._0_4_;
    auVar47._4_4_ = fVar77 + fVar77 * auVar39._4_4_;
    auVar47._8_4_ = fVar51 + fVar51 * auVar39._8_4_;
    auVar47._12_4_ = fVar78 + fVar78 * auVar39._12_4_;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar46 = vshufps_avx(auVar47,auVar47,0);
    auVar39 = vmovshdup_avx(auVar47);
    auVar69 = ZEXT1664(auVar39);
    auVar71 = vshufps_avx(auVar47,auVar47,0x55);
    auVar64 = vshufpd_avx(auVar47,auVar47,1);
    auVar76 = ZEXT1664(auVar64);
    auVar89 = vshufps_avx(auVar47,auVar47,0xaa);
    uVar35 = (ulong)(auVar47._0_4_ < 0.0) * 0x20;
    uVar36 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
    uVar37 = (ulong)(auVar64._0_4_ < 0.0) << 5 | 0x80;
    auVar39 = vshufps_avx(auVar57,auVar57,0);
    auVar108._16_16_ = auVar39;
    auVar108._0_16_ = auVar39;
    auVar39 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
    auVar113._16_16_ = auVar39;
    auVar113._0_16_ = auVar39;
    do {
      if (pNVar34 == stack) {
        return;
      }
      uVar29 = pNVar34[-1].ptr;
      pNVar34 = pNVar34 + -1;
      do {
        if ((uVar29 & 8) == 0) {
          fVar70 = (ray->dir).field_0.m128[3];
          uVar30 = (uint)uVar29 & 7;
          uVar27 = uVar29 & 0xfffffffffffffff0;
          fVar45 = auVar89._12_4_;
          if (uVar30 == 3) {
            auVar39 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
            fVar70 = 1.0 - fVar70;
            fVar107 = auVar39._0_4_;
            fVar110 = auVar39._4_4_;
            fVar111 = auVar39._8_4_;
            fVar112 = auVar39._12_4_;
            auVar39 = vshufps_avx(ZEXT416((uint)(fVar70 * 0.0)),ZEXT416((uint)(fVar70 * 0.0)),0);
            fVar101 = auVar39._0_4_;
            fVar103 = auVar39._4_4_;
            fVar104 = auVar39._8_4_;
            fVar105 = auVar39._12_4_;
            auVar50._0_4_ =
                 fVar83 * *(float *)(uVar27 + 0x40) +
                 fVar3 * *(float *)(uVar27 + 0xa0) + *(float *)(uVar27 + 0x100) * fVar4;
            auVar50._4_4_ =
                 fVar83 * *(float *)(uVar27 + 0x44) +
                 fVar3 * *(float *)(uVar27 + 0xa4) + *(float *)(uVar27 + 0x104) * fVar4;
            auVar50._8_4_ =
                 fVar83 * *(float *)(uVar27 + 0x48) +
                 fVar3 * *(float *)(uVar27 + 0xa8) + *(float *)(uVar27 + 0x108) * fVar4;
            auVar50._12_4_ =
                 fVar83 * *(float *)(uVar27 + 0x4c) +
                 fVar3 * *(float *)(uVar27 + 0xac) + *(float *)(uVar27 + 0x10c) * fVar4;
            auVar50._16_4_ =
                 fVar83 * *(float *)(uVar27 + 0x50) +
                 fVar3 * *(float *)(uVar27 + 0xb0) + *(float *)(uVar27 + 0x110) * fVar4;
            auVar50._20_4_ =
                 fVar83 * *(float *)(uVar27 + 0x54) +
                 fVar3 * *(float *)(uVar27 + 0xb4) + *(float *)(uVar27 + 0x114) * fVar4;
            auVar50._24_4_ =
                 fVar83 * *(float *)(uVar27 + 0x58) +
                 fVar3 * *(float *)(uVar27 + 0xb8) + *(float *)(uVar27 + 0x118) * fVar4;
            auVar50._28_4_ = fVar105 + fVar45 + 0.0;
            auVar75._0_4_ =
                 *(float *)(uVar27 + 0x60) * fVar83 +
                 *(float *)(uVar27 + 0xc0) * fVar3 + fVar4 * *(float *)(uVar27 + 0x120);
            auVar75._4_4_ =
                 *(float *)(uVar27 + 100) * fVar83 +
                 *(float *)(uVar27 + 0xc4) * fVar3 + fVar4 * *(float *)(uVar27 + 0x124);
            auVar75._8_4_ =
                 *(float *)(uVar27 + 0x68) * fVar83 +
                 *(float *)(uVar27 + 200) * fVar3 + fVar4 * *(float *)(uVar27 + 0x128);
            auVar75._12_4_ =
                 *(float *)(uVar27 + 0x6c) * fVar83 +
                 *(float *)(uVar27 + 0xcc) * fVar3 + fVar4 * *(float *)(uVar27 + 300);
            auVar75._16_4_ =
                 *(float *)(uVar27 + 0x70) * fVar83 +
                 *(float *)(uVar27 + 0xd0) * fVar3 + fVar4 * *(float *)(uVar27 + 0x130);
            auVar75._20_4_ =
                 *(float *)(uVar27 + 0x74) * fVar83 +
                 *(float *)(uVar27 + 0xd4) * fVar3 + fVar4 * *(float *)(uVar27 + 0x134);
            auVar75._24_4_ =
                 *(float *)(uVar27 + 0x78) * fVar83 +
                 *(float *)(uVar27 + 0xd8) * fVar3 + fVar4 * *(float *)(uVar27 + 0x138);
            auVar75._28_4_ = fVar45 + fVar45 + 0.0;
            auVar115._0_4_ =
                 *(float *)(uVar27 + 0x80) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xe0) + fVar4 * *(float *)(uVar27 + 0x140);
            auVar115._4_4_ =
                 *(float *)(uVar27 + 0x84) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xe4) + fVar4 * *(float *)(uVar27 + 0x144);
            auVar115._8_4_ =
                 *(float *)(uVar27 + 0x88) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xe8) + fVar4 * *(float *)(uVar27 + 0x148);
            auVar115._12_4_ =
                 *(float *)(uVar27 + 0x8c) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xec) + fVar4 * *(float *)(uVar27 + 0x14c);
            auVar115._16_4_ =
                 *(float *)(uVar27 + 0x90) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xf0) + fVar4 * *(float *)(uVar27 + 0x150);
            auVar115._20_4_ =
                 *(float *)(uVar27 + 0x94) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xf4) + fVar4 * *(float *)(uVar27 + 0x154);
            auVar115._24_4_ =
                 *(float *)(uVar27 + 0x98) * fVar83 +
                 fVar3 * *(float *)(uVar27 + 0xf8) + fVar4 * *(float *)(uVar27 + 0x158);
            auVar115._28_4_ = in_ZMM15._28_4_ + fVar45 + fVar105;
            auVar42._8_4_ = 0x7fffffff;
            auVar42._0_8_ = 0x7fffffff7fffffff;
            auVar42._12_4_ = 0x7fffffff;
            auVar42._16_4_ = 0x7fffffff;
            auVar42._20_4_ = 0x7fffffff;
            auVar42._24_4_ = 0x7fffffff;
            auVar42._28_4_ = 0x7fffffff;
            auVar9 = vandps_avx(auVar50,auVar42);
            auVar60._8_4_ = 0x219392ef;
            auVar60._0_8_ = 0x219392ef219392ef;
            auVar60._12_4_ = 0x219392ef;
            auVar60._16_4_ = 0x219392ef;
            auVar60._20_4_ = 0x219392ef;
            auVar60._24_4_ = 0x219392ef;
            auVar60._28_4_ = 0x219392ef;
            auVar9 = vcmpps_avx(auVar9,auVar60,1);
            auVar43 = vblendvps_avx(auVar50,auVar60,auVar9);
            auVar9 = vandps_avx(auVar75,auVar42);
            auVar9 = vcmpps_avx(auVar9,auVar60,1);
            auVar8 = vblendvps_avx(auVar75,auVar60,auVar9);
            auVar9 = vandps_avx(auVar115,auVar42);
            auVar42 = vcmpps_avx(auVar9,auVar60,1);
            auVar9 = vblendvps_avx(auVar115,auVar60,auVar42);
            auVar39 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
            fVar70 = auVar39._0_4_;
            auVar109._0_4_ = fVar107 * *(float *)(uVar27 + 0x220) + fVar70;
            fVar45 = auVar39._4_4_;
            auVar109._4_4_ = fVar110 * *(float *)(uVar27 + 0x224) + fVar45;
            fVar77 = auVar39._8_4_;
            auVar109._8_4_ = fVar111 * *(float *)(uVar27 + 0x228) + fVar77;
            fVar51 = auVar39._12_4_;
            auVar109._12_4_ = fVar112 * *(float *)(uVar27 + 0x22c) + fVar51;
            auVar109._16_4_ = fVar107 * *(float *)(uVar27 + 0x230) + fVar70;
            auVar109._20_4_ = fVar110 * *(float *)(uVar27 + 0x234) + fVar45;
            auVar109._24_4_ = fVar111 * *(float *)(uVar27 + 0x238) + fVar77;
            auVar109._28_4_ = auVar115._28_4_ + fVar51;
            auVar114._0_4_ = fVar107 * *(float *)(uVar27 + 0x240) + fVar70;
            auVar114._4_4_ = fVar110 * *(float *)(uVar27 + 0x244) + fVar45;
            auVar114._8_4_ = fVar111 * *(float *)(uVar27 + 0x248) + fVar77;
            auVar114._12_4_ = fVar112 * *(float *)(uVar27 + 0x24c) + fVar51;
            auVar114._16_4_ = fVar107 * *(float *)(uVar27 + 0x250) + fVar70;
            auVar114._20_4_ = fVar110 * *(float *)(uVar27 + 0x254) + fVar45;
            auVar114._24_4_ = fVar111 * *(float *)(uVar27 + 600) + fVar77;
            auVar114._28_4_ = auVar42._28_4_ + fVar51;
            auVar42 = vrcpps_avx(auVar43);
            auVar116._0_4_ = fVar70 + fVar107 * *(float *)(uVar27 + 0x260);
            auVar116._4_4_ = fVar45 + fVar110 * *(float *)(uVar27 + 0x264);
            auVar116._8_4_ = fVar77 + fVar111 * *(float *)(uVar27 + 0x268);
            auVar116._12_4_ = fVar51 + fVar112 * *(float *)(uVar27 + 0x26c);
            auVar116._16_4_ = fVar70 + fVar107 * *(float *)(uVar27 + 0x270);
            auVar116._20_4_ = fVar45 + fVar110 * *(float *)(uVar27 + 0x274);
            auVar116._24_4_ = fVar77 + fVar111 * *(float *)(uVar27 + 0x278);
            auVar116._28_4_ = fVar51 + 1e-18;
            fVar118 = auVar42._0_4_;
            fVar119 = auVar42._4_4_;
            auVar10._4_4_ = fVar119 * auVar43._4_4_;
            auVar10._0_4_ = fVar118 * auVar43._0_4_;
            fVar120 = auVar42._8_4_;
            auVar10._8_4_ = fVar120 * auVar43._8_4_;
            fVar121 = auVar42._12_4_;
            auVar10._12_4_ = fVar121 * auVar43._12_4_;
            fVar122 = auVar42._16_4_;
            auVar10._16_4_ = fVar122 * auVar43._16_4_;
            fVar123 = auVar42._20_4_;
            auVar10._20_4_ = fVar123 * auVar43._20_4_;
            fVar124 = auVar42._24_4_;
            auVar10._24_4_ = fVar124 * auVar43._24_4_;
            auVar10._28_4_ = fVar51;
            auVar61._8_4_ = 0x3f800000;
            auVar61._0_8_ = &DAT_3f8000003f800000;
            auVar61._12_4_ = 0x3f800000;
            auVar61._16_4_ = 0x3f800000;
            auVar61._20_4_ = 0x3f800000;
            auVar61._24_4_ = 0x3f800000;
            auVar61._28_4_ = 0x3f800000;
            auVar42 = vsubps_avx(auVar61,auVar10);
            fVar118 = fVar118 + fVar118 * auVar42._0_4_;
            fVar119 = fVar119 + fVar119 * auVar42._4_4_;
            fVar120 = fVar120 + fVar120 * auVar42._8_4_;
            fVar121 = fVar121 + fVar121 * auVar42._12_4_;
            fVar122 = fVar122 + fVar122 * auVar42._16_4_;
            fVar123 = fVar123 + fVar123 * auVar42._20_4_;
            fVar124 = fVar124 + fVar124 * auVar42._24_4_;
            auVar42 = vrcpps_avx(auVar8);
            fVar70 = auVar42._0_4_;
            fVar77 = auVar42._4_4_;
            auVar11._4_4_ = auVar8._4_4_ * fVar77;
            auVar11._0_4_ = auVar8._0_4_ * fVar70;
            fVar78 = auVar42._8_4_;
            auVar11._8_4_ = auVar8._8_4_ * fVar78;
            fVar79 = auVar42._12_4_;
            auVar11._12_4_ = auVar8._12_4_ * fVar79;
            fVar80 = auVar42._16_4_;
            auVar11._16_4_ = auVar8._16_4_ * fVar80;
            fVar81 = auVar42._20_4_;
            auVar11._20_4_ = auVar8._20_4_ * fVar81;
            fVar82 = auVar42._24_4_;
            auVar11._24_4_ = auVar8._24_4_ * fVar82;
            auVar11._28_4_ = auVar43._28_4_;
            auVar8 = vsubps_avx(auVar61,auVar11);
            fVar70 = fVar70 + fVar70 * auVar8._0_4_;
            fVar77 = fVar77 + fVar77 * auVar8._4_4_;
            fVar78 = fVar78 + fVar78 * auVar8._8_4_;
            fVar79 = fVar79 + fVar79 * auVar8._12_4_;
            fVar80 = fVar80 + fVar80 * auVar8._16_4_;
            fVar81 = fVar81 + fVar81 * auVar8._20_4_;
            fVar82 = fVar82 + fVar82 * auVar8._24_4_;
            auVar43 = vrcpps_avx(auVar9);
            fVar45 = auVar43._0_4_;
            fVar51 = auVar43._4_4_;
            auVar12._4_4_ = auVar9._4_4_ * fVar51;
            auVar12._0_4_ = auVar9._0_4_ * fVar45;
            fVar52 = auVar43._8_4_;
            auVar12._8_4_ = auVar9._8_4_ * fVar52;
            fVar53 = auVar43._12_4_;
            auVar12._12_4_ = auVar9._12_4_ * fVar53;
            fVar54 = auVar43._16_4_;
            auVar12._16_4_ = auVar9._16_4_ * fVar54;
            fVar55 = auVar43._20_4_;
            auVar12._20_4_ = auVar9._20_4_ * fVar55;
            fVar56 = auVar43._24_4_;
            auVar12._24_4_ = auVar9._24_4_ * fVar56;
            auVar12._28_4_ = auVar8._28_4_;
            auVar10 = vsubps_avx(auVar61,auVar12);
            fVar45 = fVar45 + fVar45 * auVar10._0_4_;
            fVar51 = fVar51 + fVar51 * auVar10._4_4_;
            fVar52 = fVar52 + fVar52 * auVar10._8_4_;
            fVar53 = fVar53 + fVar53 * auVar10._12_4_;
            fVar54 = fVar54 + fVar54 * auVar10._16_4_;
            fVar55 = fVar55 + fVar55 * auVar10._20_4_;
            fVar56 = fVar56 + fVar56 * auVar10._24_4_;
            fVar44 = auVar43._28_4_ + *(float *)(uVar27 + 0x17c) + 1.0;
            auVar87._0_4_ =
                 *(float *)(uVar27 + 0x40) * fVar92 +
                 *(float *)(uVar27 + 0xa0) * fVar5 +
                 *(float *)(uVar27 + 0x100) * fVar6 + *(float *)(uVar27 + 0x160);
            auVar87._4_4_ =
                 *(float *)(uVar27 + 0x44) * fVar92 +
                 *(float *)(uVar27 + 0xa4) * fVar5 +
                 *(float *)(uVar27 + 0x104) * fVar6 + *(float *)(uVar27 + 0x164);
            auVar87._8_4_ =
                 *(float *)(uVar27 + 0x48) * fVar92 +
                 *(float *)(uVar27 + 0xa8) * fVar5 +
                 *(float *)(uVar27 + 0x108) * fVar6 + *(float *)(uVar27 + 0x168);
            auVar87._12_4_ =
                 *(float *)(uVar27 + 0x4c) * fVar92 +
                 *(float *)(uVar27 + 0xac) * fVar5 +
                 *(float *)(uVar27 + 0x10c) * fVar6 + *(float *)(uVar27 + 0x16c);
            auVar87._16_4_ =
                 *(float *)(uVar27 + 0x50) * fVar92 +
                 *(float *)(uVar27 + 0xb0) * fVar5 +
                 *(float *)(uVar27 + 0x110) * fVar6 + *(float *)(uVar27 + 0x170);
            auVar87._20_4_ =
                 *(float *)(uVar27 + 0x54) * fVar92 +
                 *(float *)(uVar27 + 0xb4) * fVar5 +
                 *(float *)(uVar27 + 0x114) * fVar6 + *(float *)(uVar27 + 0x174);
            auVar87._24_4_ =
                 *(float *)(uVar27 + 0x58) * fVar92 +
                 *(float *)(uVar27 + 0xb8) * fVar5 +
                 *(float *)(uVar27 + 0x118) * fVar6 + *(float *)(uVar27 + 0x178);
            auVar87._28_4_ = *(float *)(uVar27 + 0x5c) + fVar44;
            auVar91._0_4_ =
                 *(float *)(uVar27 + 0x60) * fVar92 +
                 *(float *)(uVar27 + 0xc0) * fVar5 +
                 *(float *)(uVar27 + 0x120) * fVar6 + *(float *)(uVar27 + 0x180);
            auVar91._4_4_ =
                 *(float *)(uVar27 + 100) * fVar92 +
                 *(float *)(uVar27 + 0xc4) * fVar5 +
                 *(float *)(uVar27 + 0x124) * fVar6 + *(float *)(uVar27 + 0x184);
            auVar91._8_4_ =
                 *(float *)(uVar27 + 0x68) * fVar92 +
                 *(float *)(uVar27 + 200) * fVar5 +
                 *(float *)(uVar27 + 0x128) * fVar6 + *(float *)(uVar27 + 0x188);
            auVar91._12_4_ =
                 *(float *)(uVar27 + 0x6c) * fVar92 +
                 *(float *)(uVar27 + 0xcc) * fVar5 +
                 *(float *)(uVar27 + 300) * fVar6 + *(float *)(uVar27 + 0x18c);
            auVar91._16_4_ =
                 *(float *)(uVar27 + 0x70) * fVar92 +
                 *(float *)(uVar27 + 0xd0) * fVar5 +
                 *(float *)(uVar27 + 0x130) * fVar6 + *(float *)(uVar27 + 400);
            auVar91._20_4_ =
                 *(float *)(uVar27 + 0x74) * fVar92 +
                 *(float *)(uVar27 + 0xd4) * fVar5 +
                 *(float *)(uVar27 + 0x134) * fVar6 + *(float *)(uVar27 + 0x194);
            auVar91._24_4_ =
                 *(float *)(uVar27 + 0x78) * fVar92 +
                 *(float *)(uVar27 + 0xd8) * fVar5 +
                 *(float *)(uVar27 + 0x138) * fVar6 + *(float *)(uVar27 + 0x198);
            auVar91._28_4_ = fVar44 + auVar9._28_4_ + *(float *)(uVar27 + 0x19c) + 1.0;
            auVar94._0_4_ =
                 *(float *)(uVar27 + 0x80) * fVar92 +
                 *(float *)(uVar27 + 0xe0) * fVar5 +
                 *(float *)(uVar27 + 0x140) * fVar6 + *(float *)(uVar27 + 0x1a0);
            auVar94._4_4_ =
                 *(float *)(uVar27 + 0x84) * fVar92 +
                 *(float *)(uVar27 + 0xe4) * fVar5 +
                 *(float *)(uVar27 + 0x144) * fVar6 + *(float *)(uVar27 + 0x1a4);
            auVar94._8_4_ =
                 *(float *)(uVar27 + 0x88) * fVar92 +
                 *(float *)(uVar27 + 0xe8) * fVar5 +
                 *(float *)(uVar27 + 0x148) * fVar6 + *(float *)(uVar27 + 0x1a8);
            auVar94._12_4_ =
                 *(float *)(uVar27 + 0x8c) * fVar92 +
                 *(float *)(uVar27 + 0xec) * fVar5 +
                 *(float *)(uVar27 + 0x14c) * fVar6 + *(float *)(uVar27 + 0x1ac);
            auVar94._16_4_ =
                 *(float *)(uVar27 + 0x90) * fVar92 +
                 *(float *)(uVar27 + 0xf0) * fVar5 +
                 *(float *)(uVar27 + 0x150) * fVar6 + *(float *)(uVar27 + 0x1b0);
            auVar94._20_4_ =
                 *(float *)(uVar27 + 0x94) * fVar92 +
                 *(float *)(uVar27 + 0xf4) * fVar5 +
                 *(float *)(uVar27 + 0x154) * fVar6 + *(float *)(uVar27 + 0x1b4);
            auVar94._24_4_ =
                 *(float *)(uVar27 + 0x98) * fVar92 +
                 *(float *)(uVar27 + 0xf8) * fVar5 +
                 *(float *)(uVar27 + 0x158) * fVar6 + *(float *)(uVar27 + 0x1b8);
            auVar94._28_4_ =
                 fVar44 + *(float *)(uVar27 + 0xfc) + auVar9._28_4_ + *(float *)(uVar27 + 0x1bc);
            auVar9._4_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 0x1c4);
            auVar9._0_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x1c0);
            auVar9._8_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x1c8);
            auVar9._12_4_ = fVar105 + fVar112 * *(float *)(uVar27 + 0x1cc);
            auVar9._16_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x1d0);
            auVar9._20_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 0x1d4);
            auVar9._24_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x1d8);
            auVar9._28_4_ = fVar105 + 0.0;
            auVar9 = vsubps_avx(auVar9,auVar87);
            auVar25._4_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 0x1e4);
            auVar25._0_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x1e0);
            auVar25._8_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x1e8);
            auVar25._12_4_ = fVar105 + fVar112 * *(float *)(uVar27 + 0x1ec);
            auVar25._16_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x1f0);
            auVar25._20_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 500);
            auVar25._24_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x1f8);
            auVar25._28_4_ = fVar105 + 0.0;
            auVar11 = vsubps_avx(auVar25,auVar91);
            auVar24._4_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 0x204);
            auVar24._0_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x200);
            auVar24._8_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x208);
            auVar24._12_4_ = fVar105 + fVar112 * *(float *)(uVar27 + 0x20c);
            auVar24._16_4_ = fVar101 + fVar107 * *(float *)(uVar27 + 0x210);
            auVar24._20_4_ = fVar103 + fVar110 * *(float *)(uVar27 + 0x214);
            auVar24._24_4_ = fVar104 + fVar111 * *(float *)(uVar27 + 0x218);
            auVar24._28_4_ = fVar105 + fVar6;
            auVar12 = vsubps_avx(auVar24,auVar94);
            auVar65._0_4_ = fVar118 * auVar9._0_4_;
            auVar65._4_4_ = fVar119 * auVar9._4_4_;
            auVar65._8_4_ = fVar120 * auVar9._8_4_;
            auVar65._12_4_ = fVar121 * auVar9._12_4_;
            auVar19._16_4_ = fVar122 * auVar9._16_4_;
            auVar19._0_16_ = auVar65;
            auVar19._20_4_ = fVar123 * auVar9._20_4_;
            auVar19._24_4_ = fVar124 * auVar9._24_4_;
            auVar19._28_4_ = fVar105 + fVar6;
            auVar58._0_4_ = auVar11._0_4_ * fVar70;
            auVar58._4_4_ = auVar11._4_4_ * fVar77;
            auVar58._8_4_ = auVar11._8_4_ * fVar78;
            auVar58._12_4_ = auVar11._12_4_ * fVar79;
            auVar20._16_4_ = auVar11._16_4_ * fVar80;
            auVar20._0_16_ = auVar58;
            auVar20._20_4_ = auVar11._20_4_ * fVar81;
            auVar20._24_4_ = auVar11._24_4_ * fVar82;
            auVar20._28_4_ = auVar11._28_4_;
            auVar40._0_4_ = auVar12._0_4_ * fVar45;
            auVar40._4_4_ = auVar12._4_4_ * fVar51;
            auVar40._8_4_ = auVar12._8_4_ * fVar52;
            auVar40._12_4_ = auVar12._12_4_ * fVar53;
            auVar21._16_4_ = auVar12._16_4_ * fVar54;
            auVar21._0_16_ = auVar40;
            auVar21._20_4_ = auVar12._20_4_ * fVar55;
            auVar21._24_4_ = auVar12._24_4_ * fVar56;
            auVar21._28_4_ = auVar9._28_4_;
            auVar9 = vsubps_avx(auVar109,auVar87);
            auVar11 = vsubps_avx(auVar114,auVar91);
            auVar12 = vsubps_avx(auVar116,auVar94);
            auVar85._0_4_ = fVar118 * auVar9._0_4_;
            auVar85._4_4_ = fVar119 * auVar9._4_4_;
            auVar85._8_4_ = fVar120 * auVar9._8_4_;
            auVar85._12_4_ = fVar121 * auVar9._12_4_;
            auVar22._16_4_ = fVar122 * auVar9._16_4_;
            auVar22._0_16_ = auVar85;
            auVar22._20_4_ = fVar123 * auVar9._20_4_;
            auVar22._24_4_ = fVar124 * auVar9._24_4_;
            auVar22._28_4_ = auVar9._28_4_;
            auVar73._0_4_ = auVar11._0_4_ * fVar70;
            auVar73._4_4_ = auVar11._4_4_ * fVar77;
            auVar73._8_4_ = auVar11._8_4_ * fVar78;
            auVar73._12_4_ = auVar11._12_4_ * fVar79;
            auVar23._16_4_ = auVar11._16_4_ * fVar80;
            auVar23._0_16_ = auVar73;
            auVar23._20_4_ = auVar11._20_4_ * fVar81;
            auVar23._24_4_ = auVar11._24_4_ * fVar82;
            auVar23._28_4_ = auVar42._28_4_ + auVar8._28_4_;
            auVar48._0_4_ = auVar12._0_4_ * fVar45;
            auVar48._4_4_ = auVar12._4_4_ * fVar51;
            auVar48._8_4_ = auVar12._8_4_ * fVar52;
            auVar48._12_4_ = auVar12._12_4_ * fVar53;
            auVar8._16_4_ = auVar12._16_4_ * fVar54;
            auVar8._0_16_ = auVar48;
            auVar8._20_4_ = auVar12._20_4_ * fVar55;
            auVar8._24_4_ = auVar12._24_4_ * fVar56;
            auVar8._28_4_ = auVar43._28_4_ + auVar10._28_4_;
            auVar39 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar57 = vpminsd_avx(auVar65,auVar85);
            auVar98._16_16_ = auVar39;
            auVar98._0_16_ = auVar57;
            auVar39 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar57 = vpminsd_avx(auVar58,auVar73);
            auVar106._16_16_ = auVar39;
            auVar106._0_16_ = auVar57;
            auVar39 = vpminsd_avx(auVar21._16_16_,auVar8._16_16_);
            auVar57 = vpminsd_avx(auVar40,auVar48);
            in_ZMM15 = ZEXT1664(auVar57);
            auVar117._16_16_ = auVar39;
            auVar117._0_16_ = auVar57;
            auVar9 = vmaxps_avx(auVar106,auVar117);
            auVar39 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar57 = vpmaxsd_avx(auVar65,auVar85);
            auVar68._16_16_ = auVar39;
            auVar68._0_16_ = auVar57;
            auVar69 = ZEXT3264(auVar68);
            auVar39 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar88 = ZEXT1664(auVar39);
            auVar57 = vpmaxsd_avx(auVar58,auVar73);
            auVar62._16_16_ = auVar39;
            auVar62._0_16_ = auVar57;
            auVar39 = vpmaxsd_avx(auVar21._16_16_,auVar8._16_16_);
            auVar76 = ZEXT1664(auVar39);
            auVar57 = vpmaxsd_avx(auVar40,auVar48);
            auVar43._16_16_ = auVar39;
            auVar43._0_16_ = auVar57;
            auVar8 = vminps_avx(auVar62,auVar43);
            auVar43 = vmaxps_avx(auVar108,auVar98);
            auVar9 = vmaxps_avx(auVar43,auVar9);
            auVar43 = vminps_avx(auVar113,auVar68);
            auVar63 = ZEXT3264(auVar43);
            auVar43 = vminps_avx(auVar43,auVar8);
            auVar9 = vcmpps_avx(auVar9,auVar43,2);
            uVar38 = vmovmskps_avx(auVar9);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar38);
          }
          else {
            auVar39 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
            auVar41._16_16_ = auVar39;
            auVar41._0_16_ = auVar39;
            pfVar2 = (float *)(uVar27 + 0x100 + uVar35);
            fVar70 = auVar39._0_4_;
            fVar77 = auVar39._4_4_;
            fVar51 = auVar39._8_4_;
            fVar78 = auVar39._12_4_;
            pfVar1 = (float *)(uVar27 + 0x40 + uVar35);
            auVar49._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar49._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar49._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar49._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar49._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar49._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar49._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar49._28_4_ = pfVar1[7] + 0.0;
            auVar9 = vsubps_avx(auVar49,auVar90);
            fVar52 = auVar46._0_4_;
            fVar79 = auVar46._4_4_;
            auVar13._4_4_ = fVar79 * auVar9._4_4_;
            auVar13._0_4_ = fVar52 * auVar9._0_4_;
            fVar53 = auVar46._8_4_;
            auVar13._8_4_ = fVar53 * auVar9._8_4_;
            auVar13._12_4_ = auVar46._12_4_ * auVar9._12_4_;
            auVar13._16_4_ = fVar52 * auVar9._16_4_;
            auVar13._20_4_ = fVar79 * auVar9._20_4_;
            auVar13._24_4_ = fVar53 * auVar9._24_4_;
            auVar13._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar27 + 0x100 + uVar36);
            pfVar1 = (float *)(uVar27 + 0x40 + uVar36);
            auVar59._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar59._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar59._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar59._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar59._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar59._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar59._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar59._28_4_ = auVar63._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar59,auVar93);
            fVar80 = auVar71._0_4_;
            fVar54 = auVar71._4_4_;
            auVar14._4_4_ = fVar54 * auVar9._4_4_;
            auVar14._0_4_ = fVar80 * auVar9._0_4_;
            fVar81 = auVar71._8_4_;
            auVar14._8_4_ = fVar81 * auVar9._8_4_;
            auVar14._12_4_ = auVar71._12_4_ * auVar9._12_4_;
            auVar14._16_4_ = fVar80 * auVar9._16_4_;
            auVar14._20_4_ = fVar54 * auVar9._20_4_;
            auVar14._24_4_ = fVar81 * auVar9._24_4_;
            auVar14._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar27 + 0x100 + uVar37);
            pfVar1 = (float *)(uVar27 + 0x40 + uVar37);
            auVar66._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar66._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar66._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar66._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar66._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar66._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar66._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar66._28_4_ = auVar69._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar66,auVar97);
            fVar55 = auVar89._0_4_;
            fVar82 = auVar89._4_4_;
            auVar15._4_4_ = fVar82 * auVar9._4_4_;
            auVar15._0_4_ = fVar55 * auVar9._0_4_;
            fVar56 = auVar89._8_4_;
            auVar15._8_4_ = fVar56 * auVar9._8_4_;
            auVar15._12_4_ = fVar45 * auVar9._12_4_;
            auVar15._16_4_ = fVar55 * auVar9._16_4_;
            auVar15._20_4_ = fVar82 * auVar9._20_4_;
            auVar15._24_4_ = fVar56 * auVar9._24_4_;
            auVar15._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar27 + 0x100 + (uVar35 ^ 0x20));
            auVar9 = vmaxps_avx(auVar14,auVar15);
            pfVar1 = (float *)(uVar27 + 0x40 + (uVar35 ^ 0x20));
            auVar67._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar67._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar67._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar67._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar67._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar67._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar67._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar67._28_4_ = auVar76._28_4_ + pfVar1[7];
            auVar43 = vsubps_avx(auVar67,auVar90);
            pfVar2 = (float *)(uVar27 + 0x100 + (uVar36 ^ 0x20));
            pfVar1 = (float *)(uVar27 + 0x40 + (uVar36 ^ 0x20));
            auVar74._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar74._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar74._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar74._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar74._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar74._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar74._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar74._28_4_ = auVar76._28_4_ + pfVar1[7];
            auVar16._4_4_ = fVar79 * auVar43._4_4_;
            auVar16._0_4_ = fVar52 * auVar43._0_4_;
            auVar16._8_4_ = fVar53 * auVar43._8_4_;
            auVar16._12_4_ = auVar46._12_4_ * auVar43._12_4_;
            auVar16._16_4_ = fVar52 * auVar43._16_4_;
            auVar16._20_4_ = fVar79 * auVar43._20_4_;
            auVar16._24_4_ = fVar53 * auVar43._24_4_;
            auVar16._28_4_ = auVar43._28_4_;
            auVar69 = ZEXT3264(auVar16);
            auVar43 = vsubps_avx(auVar74,auVar93);
            pfVar2 = (float *)(uVar27 + 0x100 + (uVar37 ^ 0x20));
            auVar17._4_4_ = fVar54 * auVar43._4_4_;
            auVar17._0_4_ = fVar80 * auVar43._0_4_;
            auVar17._8_4_ = fVar81 * auVar43._8_4_;
            auVar17._12_4_ = auVar71._12_4_ * auVar43._12_4_;
            auVar17._16_4_ = fVar80 * auVar43._16_4_;
            auVar17._20_4_ = fVar54 * auVar43._20_4_;
            auVar17._24_4_ = fVar81 * auVar43._24_4_;
            auVar17._28_4_ = auVar43._28_4_;
            pfVar1 = (float *)(uVar27 + 0x40 + (uVar37 ^ 0x20));
            auVar86._0_4_ = fVar70 * *pfVar2 + *pfVar1;
            auVar86._4_4_ = fVar77 * pfVar2[1] + pfVar1[1];
            auVar86._8_4_ = fVar51 * pfVar2[2] + pfVar1[2];
            auVar86._12_4_ = fVar78 * pfVar2[3] + pfVar1[3];
            auVar86._16_4_ = fVar70 * pfVar2[4] + pfVar1[4];
            auVar86._20_4_ = fVar77 * pfVar2[5] + pfVar1[5];
            auVar86._24_4_ = fVar51 * pfVar2[6] + pfVar1[6];
            auVar86._28_4_ = auVar88._28_4_ + pfVar1[7];
            auVar43 = vsubps_avx(auVar86,auVar97);
            auVar18._4_4_ = fVar82 * auVar43._4_4_;
            auVar18._0_4_ = fVar55 * auVar43._0_4_;
            auVar18._8_4_ = fVar56 * auVar43._8_4_;
            auVar18._12_4_ = fVar45 * auVar43._12_4_;
            auVar18._16_4_ = fVar55 * auVar43._16_4_;
            auVar18._20_4_ = fVar82 * auVar43._20_4_;
            auVar18._24_4_ = fVar56 * auVar43._24_4_;
            auVar18._28_4_ = auVar43._28_4_;
            auVar88 = ZEXT3264(auVar18);
            auVar8 = vminps_avx(auVar17,auVar18);
            auVar76 = ZEXT3264(auVar8);
            auVar43 = vmaxps_avx(auVar108,auVar13);
            auVar9 = vmaxps_avx(auVar43,auVar9);
            auVar43 = vminps_avx(auVar113,auVar16);
            auVar43 = vminps_avx(auVar43,auVar8);
            auVar9 = vcmpps_avx(auVar9,auVar43,2);
            if (uVar30 == 6) {
              auVar43 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0x1c0),auVar41,2);
              auVar8 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar27 + 0x1e0),1);
              auVar8 = vandps_avx(auVar43,auVar8);
              auVar9 = vandps_avx(auVar8,auVar9);
              auVar39 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
            }
            else {
              auVar39 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
            }
            auVar63 = ZEXT3264(auVar43);
            auVar39 = vpsllw_avx(auVar39,0xf);
            auVar39 = vpacksswb_avx(auVar39,auVar39);
            unaff_R15 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 |
                                      (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar39 >> 0x3f,0) << 7);
          }
        }
        if ((uVar29 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar31 = 4;
          }
          else {
            uVar27 = uVar29 & 0xfffffffffffffff0;
            lVar33 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
              }
            }
            iVar31 = 0;
            uVar29 = *(ulong *)(uVar27 + lVar33 * 8);
            uVar32 = unaff_R15 - 1 & unaff_R15;
            if (uVar32 != 0) {
              pNVar34->ptr = uVar29;
              lVar33 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                }
              }
              uVar28 = uVar32 - 1;
              while( true ) {
                pNVar34 = pNVar34 + 1;
                uVar29 = *(ulong *)(uVar27 + lVar33 * 8);
                uVar28 = uVar28 & uVar32;
                if (uVar28 == 0) break;
                pNVar34->ptr = uVar29;
                lVar33 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                  }
                }
                uVar32 = uVar28 - 1;
              }
            }
          }
        }
        else {
          iVar31 = 6;
        }
      } while (iVar31 == 0);
      if (iVar31 == 6) {
        auVar63 = ZEXT1664(auVar63._0_16_);
        auVar69 = ZEXT1664(auVar69._0_16_);
        auVar76 = ZEXT1664(auVar76._0_16_);
        auVar88 = ZEXT1664(auVar88._0_16_);
        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
        cVar26 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar29 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar31 = 0;
        if (cVar26 != '\0') {
          ray->tfar = -INFINITY;
          iVar31 = 3;
        }
      }
    } while (iVar31 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }